

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

bool __thiscall leveldb::MemTable::Get(MemTable *this,LookupKey *key,string *value,Status *s)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  Slice SVar4;
  uint32_t key_length;
  Iterator iter;
  uint local_6c;
  Slice local_68;
  Status local_58;
  Slice local_50;
  Iterator local_40;
  
  local_68.data_ = key->start_;
  local_40.list_ = &this->table_;
  local_40.node_ = (Node *)0x0;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Seek
            (&local_40,&local_68.data_);
  if (local_40.node_ != (Node *)0x0) {
    ppcVar2 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::key(&local_40);
    pcVar3 = GetVarint32Ptr(*ppcVar2,*ppcVar2 + 5,&local_6c);
    local_68.size_ = (size_t)(local_6c - 8);
    local_50.data_ = key->kstart_;
    local_50.size_ = (size_t)(key->end_ + (-8 - (long)local_50.data_));
    local_68.data_ = pcVar3;
    iVar1 = (*((this->comparator_).comparator.user_comparator_)->_vptr_Comparator[2])();
    if (iVar1 == 0) {
      if (pcVar3[(ulong)local_6c - 8] == '\0') {
        local_68.data_ = "";
        local_68.size_ = 0;
        local_50.data_ = "";
        local_50.size_ = 0;
        Status::NotFound(&local_58,&local_68,&local_50);
        pcVar3 = s->state_;
        s->state_ = (char *)local_58;
        local_58.state_ = pcVar3;
        Status::~Status(&local_58);
      }
      else {
        if (pcVar3[(ulong)local_6c - 8] != '\x01') {
          return false;
        }
        SVar4 = GetLengthPrefixedSlice(pcVar3 + local_6c);
        std::__cxx11::string::assign((char *)value,(ulong)SVar4.data_);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool MemTable::Get(const LookupKey& key, std::string* value, Status* s) {
  Slice memkey = key.memtable_key();
  Table::Iterator iter(&table_);
  iter.Seek(memkey.data());
  if (iter.Valid()) {
    // entry format is:
    //    klength  varint32
    //    userkey  char[klength]
    //    tag      uint64
    //    vlength  varint32
    //    value    char[vlength]
    // Check that it belongs to same user key.  We do not check the
    // sequence number since the Seek() call above should have skipped
    // all entries with overly large sequence numbers.
    const char* entry = iter.key();
    uint32_t key_length;
    const char* key_ptr = GetVarint32Ptr(entry, entry + 5, &key_length);
    if (comparator_.comparator.user_comparator()->Compare(
            Slice(key_ptr, key_length - 8), key.user_key()) == 0) {
      // Correct user key
      const uint64_t tag = DecodeFixed64(key_ptr + key_length - 8);
      switch (static_cast<ValueType>(tag & 0xff)) {
        case kTypeValue: {
          Slice v = GetLengthPrefixedSlice(key_ptr + key_length);
          value->assign(v.data(), v.size());
          return true;
        }
        case kTypeDeletion:
          *s = Status::NotFound(Slice());
          return true;
      }
    }
  }
  return false;
}